

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap.cpp
# Opt level: O3

bool Omega_h::swap_edges(Mesh *mesh,AdaptOpts *opts)

{
  uint uVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_a9;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_swap.cpp"
             ,"");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_78 = *puVar5;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar5;
    local_88 = (ulong *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\x02');
  *(undefined2 *)local_68 = 0x3634;
  uVar6 = 0xf;
  if (local_88 != &local_78) {
    uVar6 = local_78;
  }
  if (uVar6 < (ulong)(local_60 + local_80)) {
    uVar6 = 0xf;
    if (local_68 != local_58) {
      uVar6 = local_58[0];
    }
    if ((ulong)(local_60 + local_80) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_003e2b34;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_003e2b34:
  local_a8 = &local_98;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_98 = *plVar3;
    uStack_90 = puVar4[3];
  }
  else {
    local_98 = *plVar3;
    local_a8 = (long *)*puVar4;
  }
  local_a0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  begin_code("swap_edges",(char *)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  uVar1 = mesh->dim_;
  if (uVar1 < 4) {
    if (uVar1 == 2) {
      bVar2 = swap_edges_2d(mesh,opts);
    }
    else if (uVar1 == 3) {
      bVar2 = swap_edges_3d(mesh,opts);
    }
    else {
      bVar2 = false;
    }
    ScopedTimer::~ScopedTimer(&local_a9);
    return bVar2;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

bool swap_edges(Mesh* mesh, AdaptOpts const& opts) {
  OMEGA_H_TIME_FUNCTION;
  bool ret = false;
  if (mesh->dim() == 3)
    ret = swap_edges_3d(mesh, opts);
  else if (mesh->dim() == 2)
    ret = swap_edges_2d(mesh, opts);
  return ret;
}